

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void __thiscall
DnsStats::SubmitRegistryStringAndCount
          (DnsStats *this,uint32_t registry_id,uint32_t length,uint8_t *value,uint64_t count)

{
  bool stored;
  DnsHashEntry key;
  bool local_89;
  DnsHashEntry local_88;
  
  DnsHashEntry::DnsHashEntry(&local_88);
  local_89 = false;
  if (length < 0x40) {
    local_88.key_type = 1;
    local_88.registry_id = registry_id;
    local_88.count = count;
    local_88.key_length = length;
    memcpy(&local_88.field_6,value,(ulong)length);
    local_88.field_6.key_value[length] = '\0';
    BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_88,true,&local_89);
  }
  DnsHashEntry::~DnsHashEntry(&local_88);
  return;
}

Assistant:

void DnsStats::SubmitRegistryStringAndCount(uint32_t registry_id, uint32_t length, uint8_t * value, uint64_t count)
{
    DnsHashEntry key;
    bool stored = false;

    if (length < 64)
    {
        key.count = count;
        key.registry_id = registry_id;
        key.key_length = length;
        key.key_type = 1; /* string */
        memcpy(key.key_value, value, length);
        key.key_value[length] = 0;

        (void)hashTable.InsertOrAdd(&key, true, &stored);
    }
}